

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

UInt32 crnlib::GetPureRepPrice(CLzmaEnc *p,UInt32 repIndex,UInt32 state,UInt32 posState)

{
  UInt32 local_20;
  UInt32 price;
  UInt32 posState_local;
  UInt32 state_local;
  UInt32 repIndex_local;
  CLzmaEnc *p_local;
  
  if (repIndex == 0) {
    local_20 = p->ProbPrices[(int)(p->isRep0Long[state][posState] ^ 0x7ff) >> 4] +
               p->ProbPrices[(int)(uint)p->isRepG0[state] >> 4];
  }
  else if (repIndex == 1) {
    local_20 = p->ProbPrices[(int)(uint)p->isRepG1[state] >> 4] +
               p->ProbPrices[(int)(p->isRepG0[state] ^ 0x7ff) >> 4];
  }
  else {
    local_20 = p->ProbPrices[(int)((uint)p->isRepG2[state] ^ -(repIndex - 2) & 0x7ff) >> 4] +
               p->ProbPrices[(int)(p->isRepG1[state] ^ 0x7ff) >> 4] +
               p->ProbPrices[(int)(p->isRepG0[state] ^ 0x7ff) >> 4];
  }
  return local_20;
}

Assistant:

static UInt32 GetPureRepPrice(CLzmaEnc* p, UInt32 repIndex, UInt32 state, UInt32 posState) {
  UInt32 price;
  if (repIndex == 0) {
    price = GET_PRICE_0(p->isRepG0[state]);
    price += GET_PRICE_1(p->isRep0Long[state][posState]);
  } else {
    price = GET_PRICE_1(p->isRepG0[state]);
    if (repIndex == 1)
      price += GET_PRICE_0(p->isRepG1[state]);
    else {
      price += GET_PRICE_1(p->isRepG1[state]);
      price += GET_PRICE(p->isRepG2[state], repIndex - 2);
    }
  }
  return price;
}